

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O1

SEND_ONE_MESSAGE_RESULT
send_one_message(MESSAGE_SENDER_INSTANCE *message_sender,ASYNC_OPERATION_HANDLE pending_send,
                MESSAGE_HANDLE message)

{
  ulong uVar1;
  ASYNC_OPERATION_HANDLE *ppAVar2;
  bool bVar3;
  MESSAGE_SENDER_INSTANCE *pMVar4;
  ASYNC_OPERATION_HANDLE pAVar5;
  ulong uVar6;
  int iVar7;
  LOGGER_LOG p_Var8;
  AMQP_VALUE pAVar9;
  AMQP_VALUE pAVar10;
  AMQP_VALUE pAVar11;
  ASYNC_OPERATION_HANDLE pAVar12;
  size_t __size;
  size_t sVar13;
  ulong uVar14;
  char *pcVar15;
  SEND_ONE_MESSAGE_RESULT SVar16;
  bool bVar17;
  data value;
  data value_00;
  size_t encoded_size;
  AMQP_VALUE message_body_amqp_value;
  size_t body_data_count;
  MESSAGE_BODY_TYPE message_body_type;
  AMQP_VALUE msg_annotations;
  AMQP_VALUE application_properties;
  PROPERTIES_HANDLE properties;
  message_format message_format;
  HEADER_HANDLE header;
  LINK_TRANSFER_RESULT link_transfer_error;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 uVar18;
  size_t local_c8;
  AMQP_VALUE local_c0;
  MESSAGE_SENDER_INSTANCE *local_b8;
  BINARY_DATA local_b0;
  size_t local_a0;
  AMQP_VALUE local_98;
  MESSAGE_BODY_TYPE local_8c;
  annotations local_88;
  AMQP_VALUE local_80;
  AMQP_VALUE local_78;
  PROPERTIES_HANDLE local_70;
  message_format local_64;
  HEADER_HANDLE local_60;
  BINARY_DATA local_58;
  AMQP_VALUE local_48;
  AMQP_VALUE local_40;
  ASYNC_OPERATION_HANDLE local_38;
  
  iVar7 = message_get_body_type(message,&local_8c);
  if ((iVar7 != 0) || (iVar7 = message_get_message_format(message,&local_64), iVar7 != 0)) {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"send_one_message",0xe4,1,"Failure getting message body type and/or message format"
               );
      return SEND_ONE_MESSAGE_ERROR;
    }
    return SEND_ONE_MESSAGE_ERROR;
  }
  __size = 0;
  local_60 = (HEADER_HANDLE)0x0;
  local_70 = (PROPERTIES_HANDLE)0x0;
  local_78 = (AMQP_VALUE)0x0;
  local_a0 = 0;
  local_88 = (AMQP_VALUE)0x0;
  local_b8 = message_sender;
  iVar7 = message_get_header(message,&local_60);
  local_38 = pending_send;
  if (local_60 == (HEADER_HANDLE)0x0 || iVar7 != 0) {
    bVar17 = false;
    pAVar9 = (AMQP_VALUE)0x0;
  }
  else {
    pAVar9 = amqpvalue_create_header(local_60);
    if (pAVar9 == (AMQP_VALUE)0x0) {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 == (LOGGER_LOG)0x0) {
        pAVar9 = (AMQP_VALUE)0x0;
      }
      else {
        pAVar9 = (AMQP_VALUE)0x0;
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                  ,"send_one_message",0xfc,1,"Cannot create header AMQP value");
      }
LAB_0015a532:
      bVar17 = true;
      __size = 0;
    }
    else {
      iVar7 = amqpvalue_get_encoded_size(pAVar9,&local_c8);
      if (iVar7 == 0) {
        bVar17 = false;
        __size = local_c8;
      }
      else {
        p_Var8 = xlogging_get_log_function();
        bVar17 = true;
        if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0015a532;
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                  ,"send_one_message",0x103,1,"Cannot obtain header encoded size");
        __size = 0;
      }
    }
  }
  if ((!bVar17) &&
     (iVar7 = message_get_message_annotations(message,&local_88),
     local_88 != (AMQP_VALUE)0x0 && iVar7 == 0)) {
    iVar7 = amqpvalue_get_encoded_size(local_88,&local_c8);
    if (iVar7 == 0) {
      __size = __size + local_c8;
    }
    else {
      p_Var8 = xlogging_get_log_function();
      bVar17 = true;
      if (p_Var8 != (LOGGER_LOG)0x0) {
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                  ,"send_one_message",0x115,1,"Cannot obtain message annotations encoded size");
      }
    }
  }
  if ((bVar17) ||
     (iVar7 = message_get_properties(message,&local_70),
     local_70 == (PROPERTIES_HANDLE)0x0 || iVar7 != 0)) {
LAB_0015a668:
    pAVar10 = (AMQP_VALUE)0x0;
  }
  else {
    pAVar10 = amqpvalue_create_properties(local_70);
    if (pAVar10 == (AMQP_VALUE)0x0) {
      p_Var8 = xlogging_get_log_function();
      bVar17 = true;
      if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0015a668;
      pcVar15 = "Cannot create message properties AMQP value";
      pAVar10 = (AMQP_VALUE)0x0;
      iVar7 = 0x126;
LAB_0015a65b:
      bVar17 = true;
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                ,"send_one_message",iVar7,1,pcVar15);
    }
    else {
      iVar7 = amqpvalue_get_encoded_size(pAVar10,&local_c8);
      if (iVar7 == 0) {
        __size = __size + local_c8;
      }
      else {
        p_Var8 = xlogging_get_log_function();
        bVar17 = true;
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar15 = "Cannot obtain message properties encoded size";
          iVar7 = 0x12d;
          goto LAB_0015a65b;
        }
      }
    }
  }
  if (bVar17) {
LAB_0015a670:
    local_c0 = (AMQP_VALUE)0x0;
  }
  else {
    iVar7 = message_get_application_properties(message,&local_78);
    if (local_78 == (AMQP_VALUE)0x0 || iVar7 != 0) {
      local_c0 = (AMQP_VALUE)0x0;
    }
    else {
      local_c0 = amqpvalue_create_application_properties(local_78);
      if (local_c0 == (AMQP_VALUE)0x0) {
        p_Var8 = xlogging_get_log_function();
        bVar17 = true;
        if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0015a670;
        pcVar15 = "Cannot create application properties AMQP value";
        local_c0 = (AMQP_VALUE)0x0;
        iVar7 = 0x13f;
LAB_0015a749:
        bVar17 = true;
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                  ,"send_one_message",iVar7,1,pcVar15);
      }
      else {
        iVar7 = amqpvalue_get_encoded_size(local_c0,&local_c8);
        if (iVar7 == 0) {
          __size = __size + local_c8;
        }
        else {
          p_Var8 = xlogging_get_log_function();
          bVar17 = true;
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar15 = "Cannot obtain application properties encoded size";
            iVar7 = 0x146;
            goto LAB_0015a749;
          }
        }
      }
    }
  }
  SVar16 = SEND_ONE_MESSAGE_ERROR;
  if (bVar17) goto LAB_0015ad11;
  local_40 = pAVar9;
  if (local_8c == MESSAGE_BODY_TYPE_DATA) {
    iVar7 = message_get_body_amqp_data_count(message,&local_a0);
    if (iVar7 == 0) {
      if (local_a0 == 0) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar15 = "Body data count is zero";
          iVar7 = 399;
          goto LAB_0015a825;
        }
        goto LAB_0015aa9d;
      }
      if (local_a0 == 0) {
        bVar17 = false;
      }
      else {
        bVar17 = false;
        sVar13 = 0;
        local_98 = pAVar10;
        do {
          iVar7 = message_get_body_amqp_data_in_place(message,sVar13,&local_b0);
          if (iVar7 == 0) {
            value.length = (undefined4)local_b0.length;
            value.bytes = local_b0.bytes;
            value._12_4_ = 0;
            pAVar9 = amqpvalue_create_data(value);
            if (pAVar9 == (AMQP_VALUE)0x0) {
              p_Var8 = xlogging_get_log_function();
              if (p_Var8 == (LOGGER_LOG)0x0) {
                bVar17 = true;
                pAVar10 = local_98;
              }
              else {
                bVar17 = true;
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                          ,"send_one_message",0x1a4,1,"Cannot create body AMQP data");
                pAVar10 = local_98;
              }
            }
            else {
              iVar7 = amqpvalue_get_encoded_size(pAVar9,&local_c8);
              if (iVar7 == 0) {
                __size = __size + local_c8;
              }
              else {
                p_Var8 = xlogging_get_log_function();
                if (p_Var8 == (LOGGER_LOG)0x0) {
                  bVar17 = true;
                }
                else {
                  bVar17 = true;
                  (*p_Var8)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                            ,"send_one_message",0x1ab,1,"Cannot get body AMQP data encoded size");
                }
              }
              amqpvalue_destroy(pAVar9);
              pAVar10 = local_98;
            }
          }
          else {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 == (LOGGER_LOG)0x0) {
              bVar17 = true;
            }
            else {
              in_stack_ffffffffffffff28 =
                   CONCAT44((int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)sVar13);
              bVar17 = true;
              (*p_Var8)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",0x198,1,"Cannot get body AMQP data %u",
                        in_stack_ffffffffffffff28);
            }
          }
          sVar13 = sVar13 + 1;
        } while (sVar13 < local_a0);
      }
    }
    else {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 == (LOGGER_LOG)0x0) {
LAB_0015aa9d:
        bVar17 = true;
      }
      else {
        pcVar15 = "Cannot get body AMQP data count";
        iVar7 = 0x188;
LAB_0015a825:
        bVar17 = true;
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                  ,"send_one_message",iVar7,1,pcVar15);
      }
    }
    pAVar11 = (AMQP_VALUE)0x0;
  }
  else {
    if (local_8c == MESSAGE_BODY_TYPE_VALUE) {
      iVar7 = message_get_body_amqp_value_in_place(message,(AMQP_VALUE *)&local_b0);
      if (iVar7 == 0) {
        pAVar11 = amqpvalue_create_amqp_value((AMQP_VALUE)local_b0.bytes);
        if (pAVar11 != (AMQP_VALUE)0x0) {
          iVar7 = amqpvalue_get_encoded_size(pAVar11,&local_c8);
          if (iVar7 == 0) {
            __size = __size + local_c8;
            bVar17 = false;
          }
          else {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 != (LOGGER_LOG)0x0) {
              pcVar15 = "Cannot get body AMQP value encoded size";
              iVar7 = 0x174;
              goto LAB_0015a86a;
            }
            bVar17 = true;
          }
          goto LAB_0015aaa5;
        }
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0015aa9d;
        pcVar15 = "Cannot create body AMQP value";
        pAVar11 = (AMQP_VALUE)0x0;
        iVar7 = 0x16d;
      }
      else {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0015aa9d;
        pcVar15 = "Cannot obtain AMQP value from body";
        pAVar11 = (AMQP_VALUE)0x0;
        iVar7 = 0x165;
      }
    }
    else {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0015aa9d;
      pcVar15 = "Unknown body type";
      pAVar11 = (AMQP_VALUE)0x0;
      iVar7 = 0x15c;
    }
LAB_0015a86a:
    bVar17 = true;
    (*p_Var8)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
              ,"send_one_message",iVar7,1,pcVar15);
  }
LAB_0015aaa5:
  pAVar9 = local_40;
  if (bVar17) goto LAB_0015ad11;
  local_b0.bytes = (uchar *)malloc(__size);
  local_b0.length._0_4_ = 0;
  local_b0.length._4_4_ = 0;
  local_48 = (AMQP_VALUE)local_b0.bytes;
  if (local_60 == (HEADER_HANDLE)0x0) {
    bVar17 = false;
  }
  else {
    iVar7 = amqpvalue_encode(pAVar9,encode_bytes,&local_b0);
    if (iVar7 == 0) {
      bVar17 = false;
    }
    else {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 == (LOGGER_LOG)0x0) {
        bVar17 = true;
      }
      else {
        bVar17 = true;
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                  ,"send_one_message",0x1c9,1,"Cannot encode header value");
      }
    }
    log_message_chunk(local_b8,"Header:",pAVar9);
  }
  if (local_88 != (AMQP_VALUE)0x0 && !bVar17) {
    iVar7 = amqpvalue_encode(local_88,encode_bytes,&local_b0);
    if (iVar7 == 0) {
      bVar17 = false;
    }
    else {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 == (LOGGER_LOG)0x0) {
        bVar17 = true;
      }
      else {
        bVar17 = true;
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                  ,"send_one_message",0x1d4,1,"Cannot encode message annotations value");
      }
    }
    log_message_chunk(local_b8,"Message Annotations:",local_88);
  }
  if ((!bVar17) && (local_70 != (PROPERTIES_HANDLE)0x0)) {
    iVar7 = amqpvalue_encode(pAVar10,encode_bytes,&local_b0);
    if (iVar7 == 0) {
      bVar17 = false;
    }
    else {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 == (LOGGER_LOG)0x0) {
        bVar17 = true;
      }
      else {
        bVar17 = true;
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                  ,"send_one_message",0x1df,1,"Cannot encode message properties value");
      }
    }
    log_message_chunk(local_b8,"Properties:",pAVar10);
  }
  if ((!bVar17) && (local_78 != (AMQP_VALUE)0x0)) {
    iVar7 = amqpvalue_encode(local_c0,encode_bytes,&local_b0);
    if (iVar7 == 0) {
      bVar17 = false;
    }
    else {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 == (LOGGER_LOG)0x0) {
        bVar17 = true;
      }
      else {
        bVar17 = true;
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                  ,"send_one_message",0x1ea,1,"Cannot encode application properties value");
      }
    }
    log_message_chunk(local_b8,"Application properties:",local_c0);
  }
  SVar16 = SEND_ONE_MESSAGE_ERROR;
  bVar3 = true;
  local_80 = pAVar11;
  if (!bVar17) {
    if (local_8c == MESSAGE_BODY_TYPE_DATA) {
      if (local_a0 == 0) {
        bVar3 = false;
      }
      else {
        bVar3 = false;
        sVar13 = 0;
        local_98 = pAVar10;
        do {
          iVar7 = message_get_body_amqp_data_in_place(message,sVar13,&local_58);
          if (iVar7 == 0) {
            value_00._4_8_ = local_58._4_8_;
            value_00.bytes._0_4_ = (int)local_58.bytes;
            value_00._12_4_ = 0;
            pAVar10 = amqpvalue_create_data(value_00);
            if (pAVar10 == (AMQP_VALUE)0x0) {
              p_Var8 = xlogging_get_log_function();
              bVar17 = true;
              if (p_Var8 == (LOGGER_LOG)0x0) {
                bVar3 = true;
              }
              else {
                uVar18 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
                iVar7 = 0x21a;
                pcVar15 = "Cannot create body AMQP data %u";
                bVar17 = true;
LAB_0015aff1:
                in_stack_ffffffffffffff28 = CONCAT44(uVar18,(int)sVar13);
                bVar3 = true;
                (*p_Var8)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                          ,"send_one_message",iVar7,1,pcVar15,in_stack_ffffffffffffff28);
              }
            }
            else {
              iVar7 = amqpvalue_encode(pAVar10,encode_bytes,&local_b0);
              if (iVar7 == 0) {
                amqpvalue_destroy(pAVar10);
                bVar17 = true;
              }
              else {
                p_Var8 = xlogging_get_log_function();
                if (p_Var8 != (LOGGER_LOG)0x0) {
                  uVar18 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
                  iVar7 = 0x221;
                  pcVar15 = "Cannot encode body AMQP data %u";
                  bVar17 = false;
                  goto LAB_0015aff1;
                }
                bVar3 = true;
                bVar17 = false;
              }
            }
            pAVar10 = local_98;
            if (!bVar17) break;
          }
          else {
            p_Var8 = xlogging_get_log_function();
            if (p_Var8 == (LOGGER_LOG)0x0) {
              bVar3 = true;
            }
            else {
              in_stack_ffffffffffffff28 =
                   CONCAT44((int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)sVar13);
              bVar3 = true;
              (*p_Var8)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                        ,"send_one_message",0x20e,1,"Cannot get AMQP data %u",
                        in_stack_ffffffffffffff28);
            }
          }
          sVar13 = sVar13 + 1;
        } while (sVar13 < local_a0);
      }
    }
    else if (local_8c == MESSAGE_BODY_TYPE_VALUE) {
      iVar7 = amqpvalue_encode(pAVar11,encode_bytes,&local_b0);
      if (iVar7 == 0) {
        bVar3 = false;
      }
      else {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 == (LOGGER_LOG)0x0) {
          bVar3 = true;
        }
        else {
          bVar3 = true;
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                    ,"send_one_message",0x1fe,1,"Cannot encode body AMQP value");
        }
      }
      log_message_chunk(local_b8,"Body - amqp value:",local_80);
    }
    else {
      p_Var8 = xlogging_get_log_function();
      bVar3 = true;
      if (p_Var8 != (LOGGER_LOG)0x0) {
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                  ,"send_one_message",0x1f6,1,"Unknown message type");
      }
    }
  }
  pAVar5 = local_38;
  pAVar11 = local_80;
  pMVar4 = local_b8;
  if (!bVar3) {
    *(undefined4 *)&local_38[5].async_operation_cancel_handler = 1;
    pAVar12 = link_transfer_async(local_b8->link,local_64,(PAYLOAD *)&local_b0,1,on_delivery_settled
                                  ,local_38,(LINK_TRANSFER_RESULT *)&local_58,
                                  (tickcounter_ms_t)local_38[6].async_operation_cancel_handler);
    if (pAVar12 == (ASYNC_OPERATION_HANDLE)0x0) {
      if ((int)local_58.bytes == 2) {
        *(undefined4 *)&pAVar5[5].async_operation_cancel_handler = 0;
        SVar16 = SEND_ONE_MESSAGE_BUSY;
      }
      else {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 == (LOGGER_LOG)0x0) {
          SVar16 = SEND_ONE_MESSAGE_ERROR;
        }
        else {
          SVar16 = SEND_ONE_MESSAGE_ERROR;
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                    ,"send_one_message",0x240,1,"Error in link transfer");
        }
      }
    }
    else {
      uVar1 = pMVar4->message_count;
      bVar17 = uVar1 != 0;
      if (uVar1 == 0) {
LAB_0015ae8a:
        SVar16 = SEND_ONE_MESSAGE_OK;
        if (!bVar17) goto LAB_0015acf7;
      }
      else {
        ppAVar2 = pMVar4->messages;
        if (*ppAVar2 != pAVar5) {
          uVar6 = 1;
          do {
            uVar14 = uVar6;
            if (uVar1 == uVar14) break;
            uVar6 = uVar14 + 1;
          } while (ppAVar2[uVar14] != pAVar5);
          bVar17 = uVar14 < uVar1;
          goto LAB_0015ae8a;
        }
      }
      pAVar5[7].async_operation_cancel_handler = (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)pAVar12;
      SVar16 = SEND_ONE_MESSAGE_OK;
    }
  }
LAB_0015acf7:
  free(local_48);
  if (pAVar11 != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(pAVar11);
  }
LAB_0015ad11:
  if (local_60 != (HEADER_HANDLE)0x0) {
    header_destroy(local_60);
  }
  pAVar11 = local_c0;
  if (pAVar9 != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(pAVar9);
  }
  if (local_88 != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(local_88);
  }
  if (local_78 != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(local_78);
  }
  if (pAVar11 != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(pAVar11);
  }
  if (pAVar10 != (AMQP_VALUE)0x0) {
    amqpvalue_destroy(pAVar10);
  }
  if (local_70 != (PROPERTIES_HANDLE)0x0) {
    properties_destroy(local_70);
  }
  return SVar16;
}

Assistant:

static SEND_ONE_MESSAGE_RESULT send_one_message(MESSAGE_SENDER_INSTANCE* message_sender, ASYNC_OPERATION_HANDLE pending_send, MESSAGE_HANDLE message)
{
    SEND_ONE_MESSAGE_RESULT result;

    size_t encoded_size;
    size_t total_encoded_size = 0;
    MESSAGE_BODY_TYPE message_body_type;
    message_format message_format;

    if ((message_get_body_type(message, &message_body_type) != 0) ||
        (message_get_message_format(message, &message_format) != 0))
    {
        LogError("Failure getting message body type and/or message format");
        result = SEND_ONE_MESSAGE_ERROR;
    }
    else
    {
        // header
        HEADER_HANDLE header = NULL;
        AMQP_VALUE header_amqp_value = NULL;
        PROPERTIES_HANDLE properties = NULL;
        AMQP_VALUE properties_amqp_value = NULL;
        AMQP_VALUE application_properties = NULL;
        AMQP_VALUE application_properties_value = NULL;
        AMQP_VALUE body_amqp_value = NULL;
        size_t body_data_count = 0;
        AMQP_VALUE msg_annotations = NULL;
        bool is_error = false;

        // message header
        if ((message_get_header(message, &header) == 0) &&
            (header != NULL))
        {
            header_amqp_value = amqpvalue_create_header(header);
            if (header_amqp_value == NULL)
            {
                LogError("Cannot create header AMQP value");
                is_error = true;
            }
            else
            {
                if (amqpvalue_get_encoded_size(header_amqp_value, &encoded_size) != 0)
                {
                    LogError("Cannot obtain header encoded size");
                    is_error = true;
                }
                else
                {
                    total_encoded_size += encoded_size;
                }
            }

        }

        // message annotations
        if ((!is_error) &&
            (message_get_message_annotations(message, &msg_annotations) == 0) &&
            (msg_annotations != NULL))
        {
            if (amqpvalue_get_encoded_size(msg_annotations, &encoded_size) != 0)
            {
                LogError("Cannot obtain message annotations encoded size");
                is_error = true;
            }
            else
            {
                total_encoded_size += encoded_size;
            }
        }

        // properties
        if ((!is_error) &&
            (message_get_properties(message, &properties) == 0) &&
            (properties != NULL))
        {
            properties_amqp_value = amqpvalue_create_properties(properties);
            if (properties_amqp_value == NULL)
            {
                LogError("Cannot create message properties AMQP value");
                is_error = true;
            }
            else
            {
                if (amqpvalue_get_encoded_size(properties_amqp_value, &encoded_size) != 0)
                {
                    LogError("Cannot obtain message properties encoded size");
                    is_error = true;
                }
                else
                {
                    total_encoded_size += encoded_size;
                }
            }
        }

        // application properties
        if ((!is_error) &&
            (message_get_application_properties(message, &application_properties) == 0) &&
            (application_properties != NULL))
        {
            application_properties_value = amqpvalue_create_application_properties(application_properties);
            if (application_properties_value == NULL)
            {
                LogError("Cannot create application properties AMQP value");
                is_error = true;
            }
            else
            {
                if (amqpvalue_get_encoded_size(application_properties_value, &encoded_size) != 0)
                {
                    LogError("Cannot obtain application properties encoded size");
                    is_error = true;
                }
                else
                {
                    total_encoded_size += encoded_size;
                }
            }
        }

        if (is_error)
        {
            result = SEND_ONE_MESSAGE_ERROR;
        }
        else
        {
            result = SEND_ONE_MESSAGE_OK;

            // body - amqp data
            switch (message_body_type)
            {
            default:
                LogError("Unknown body type");
                result = SEND_ONE_MESSAGE_ERROR;
                break;

            case MESSAGE_BODY_TYPE_VALUE:
            {
                AMQP_VALUE message_body_amqp_value;
                if (message_get_body_amqp_value_in_place(message, &message_body_amqp_value) != 0)
                {
                    LogError("Cannot obtain AMQP value from body");
                    result = SEND_ONE_MESSAGE_ERROR;
                }
                else
                {
                    body_amqp_value = amqpvalue_create_amqp_value(message_body_amqp_value);
                    if (body_amqp_value == NULL)
                    {
                        LogError("Cannot create body AMQP value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }
                    else
                    {
                        if (amqpvalue_get_encoded_size(body_amqp_value, &encoded_size) != 0)
                        {
                            LogError("Cannot get body AMQP value encoded size");
                            result = SEND_ONE_MESSAGE_ERROR;
                        }
                        else
                        {
                            total_encoded_size += encoded_size;
                        }
                    }
                }

                break;
            }

            case MESSAGE_BODY_TYPE_DATA:
            {
                BINARY_DATA binary_data;
                size_t i;

                if (message_get_body_amqp_data_count(message, &body_data_count) != 0)
                {
                    LogError("Cannot get body AMQP data count");
                    result = SEND_ONE_MESSAGE_ERROR;
                }
                else
                {
                    if (body_data_count == 0)
                    {
                        LogError("Body data count is zero");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }
                    else
                    {
                        for (i = 0; i < body_data_count; i++)
                        {
                            if (message_get_body_amqp_data_in_place(message, i, &binary_data) != 0)
                            {
                                LogError("Cannot get body AMQP data %u", (unsigned int)i);
                                result = SEND_ONE_MESSAGE_ERROR;
                            }
                            else
                            {
                                AMQP_VALUE body_amqp_data;
                                amqp_binary binary_value;
                                binary_value.bytes = binary_data.bytes;
                                binary_value.length = (uint32_t)binary_data.length;
                                body_amqp_data = amqpvalue_create_data(binary_value);
                                if (body_amqp_data == NULL)
                                {
                                    LogError("Cannot create body AMQP data");
                                    result = SEND_ONE_MESSAGE_ERROR;
                                }
                                else
                                {
                                    if (amqpvalue_get_encoded_size(body_amqp_data, &encoded_size) != 0)
                                    {
                                        LogError("Cannot get body AMQP data encoded size");
                                        result = SEND_ONE_MESSAGE_ERROR;
                                    }
                                    else
                                    {
                                        total_encoded_size += encoded_size;
                                    }

                                    amqpvalue_destroy(body_amqp_data);
                                }
                            }
                        }
                    }
                }
                break;
            }
            }

            if (result == 0)
            {
                void* data_bytes = malloc(total_encoded_size);
                PAYLOAD payload;
                payload.bytes = (const unsigned char*)data_bytes;
                payload.length = 0;
                result = SEND_ONE_MESSAGE_OK;

                if (header != NULL)
                {
                    if (amqpvalue_encode(header_amqp_value, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode header value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Header:", header_amqp_value);
                }

                if ((result == SEND_ONE_MESSAGE_OK) && (msg_annotations != NULL))
                {
                    if (amqpvalue_encode(msg_annotations, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode message annotations value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Message Annotations:", msg_annotations);
                }

                if ((result == SEND_ONE_MESSAGE_OK) && (properties != NULL))
                {
                    if (amqpvalue_encode(properties_amqp_value, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode message properties value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Properties:", properties_amqp_value);
                }

                if ((result == SEND_ONE_MESSAGE_OK) && (application_properties != NULL))
                {
                    if (amqpvalue_encode(application_properties_value, encode_bytes, &payload) != 0)
                    {
                        LogError("Cannot encode application properties value");
                        result = SEND_ONE_MESSAGE_ERROR;
                    }

                    log_message_chunk(message_sender, "Application properties:", application_properties_value);
                }

                if (result == SEND_ONE_MESSAGE_OK)
                {
                    switch (message_body_type)
                    {
                    default:
                        LogError("Unknown message type");
                        result = SEND_ONE_MESSAGE_ERROR;
                        break;

                    case MESSAGE_BODY_TYPE_VALUE:
                    {
                        if (amqpvalue_encode(body_amqp_value, encode_bytes, &payload) != 0)
                        {
                            LogError("Cannot encode body AMQP value");
                            result = SEND_ONE_MESSAGE_ERROR;
                        }

                        log_message_chunk(message_sender, "Body - amqp value:", body_amqp_value);
                        break;
                    }
                    case MESSAGE_BODY_TYPE_DATA:
                    {
                        BINARY_DATA binary_data;
                        size_t i;

                        for (i = 0; i < body_data_count; i++)
                        {
                            if (message_get_body_amqp_data_in_place(message, i, &binary_data) != 0)
                            {
                                LogError("Cannot get AMQP data %u", (unsigned int)i);
                                result = SEND_ONE_MESSAGE_ERROR;
                            }
                            else
                            {
                                AMQP_VALUE body_amqp_data;
                                amqp_binary binary_value;
                                binary_value.bytes = binary_data.bytes;
                                binary_value.length = (uint32_t)binary_data.length;
                                body_amqp_data = amqpvalue_create_data(binary_value);
                                if (body_amqp_data == NULL)
                                {
                                    LogError("Cannot create body AMQP data %u", (unsigned int)i);
                                    result = SEND_ONE_MESSAGE_ERROR;
                                }
                                else
                                {
                                    if (amqpvalue_encode(body_amqp_data, encode_bytes, &payload) != 0)
                                    {
                                        LogError("Cannot encode body AMQP data %u", (unsigned int)i);
                                        result = SEND_ONE_MESSAGE_ERROR;
                                        break;
                                    }

                                    amqpvalue_destroy(body_amqp_data);
                                }
                            }
                        }
                        break;
                    }
                    }
                }

                if (result == SEND_ONE_MESSAGE_OK)
                {
                    ASYNC_OPERATION_HANDLE transfer_async_operation;
                    LINK_TRANSFER_RESULT link_transfer_error;
                    MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, pending_send);
                    message_with_callback->message_send_state = MESSAGE_SEND_STATE_PENDING;

                    transfer_async_operation = link_transfer_async(message_sender->link, message_format, &payload, 1, on_delivery_settled, pending_send, &link_transfer_error, message_with_callback->timeout);
                    if (transfer_async_operation == NULL)
                    {
                        if (link_transfer_error == LINK_TRANSFER_BUSY)
                        {
                            message_with_callback->message_send_state = MESSAGE_SEND_STATE_NOT_SENT;
                            result = SEND_ONE_MESSAGE_BUSY;
                        }
                        else
                        {
                            LogError("Error in link transfer");
                            result = SEND_ONE_MESSAGE_ERROR;
                        }
                    }
                    else
                    {
                        // For messages that get atomically sent and settled by link_transfer_async,
                        // on_delivery_settled is invoked and the message destroyed.
                        // So at this point we shall verify if the message still exists and is in the queue.
                        if (is_message_in_queue(message_sender, pending_send))
                        {
                            message_with_callback->transfer_async_operation = transfer_async_operation;
                        }

                        result = SEND_ONE_MESSAGE_OK;
                    }
                }

                free(data_bytes);

                if (body_amqp_value != NULL)
                {
                    amqpvalue_destroy(body_amqp_value);
                }
            }
        }

        if (header != NULL)
        {
            header_destroy(header);
        }

        if (header_amqp_value != NULL)
        {
            amqpvalue_destroy(header_amqp_value);
        }

        if (msg_annotations != NULL)
        {
            annotations_destroy(msg_annotations);
        }

        if (application_properties != NULL)
        {
            amqpvalue_destroy(application_properties);
        }

        if (application_properties_value != NULL)
        {
            amqpvalue_destroy(application_properties_value);
        }

        if (properties_amqp_value != NULL)
        {
            amqpvalue_destroy(properties_amqp_value);
        }

        if (properties != NULL)
        {
            properties_destroy(properties);
        }
    }

    return result;
}